

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cc
# Opt level: O1

void io::uci::parseGo(string *input,SearchInfo *info,Board *pos)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  istream *piVar4;
  int *piVar5;
  long lVar6;
  ulong uVar7;
  int64_t iVar8;
  undefined8 uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  bool bVar13;
  string val;
  string key;
  istringstream ss;
  char *local_220;
  Board *local_218;
  char *local_210;
  undefined8 local_208;
  char local_200;
  undefined7 uStack_1ff;
  long local_1f0;
  long local_1e8;
  ulong local_1e0;
  SearchInfo *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_218 = pos;
  local_1d8 = info;
  std::__cxx11::istringstream::istringstream(local_1b0,(string *)input,_S_in);
  local_1d0 = &local_1c0;
  local_1c8 = 0;
  local_1c0 = 0;
  local_210 = &local_200;
  local_208 = 0;
  local_1f0 = 0;
  local_200 = '\0';
  uVar10 = 0xffffffff;
  local_1e0 = 0xffffffff;
  local_1e8 = 0xffffffff;
  lVar11 = 0xffffffff;
LAB_00105a4c:
  do {
    piVar4 = std::operator>>((istream *)local_1b0,(string *)&local_1d0);
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) {
      iVar8 = utils::getTime();
      local_1d8->startTime = iVar8;
      local_1d8->depth = (int)lVar11;
      bVar13 = -1 < (int)local_1e0;
      if (bVar13) {
        uVar10 = local_1e0;
      }
      iVar2 = (int)uVar10;
      uVar12 = (uint)local_1e8;
      if (bVar13) {
        uVar12 = 1;
      }
      if ((-1 < iVar2) && (0 < (int)uVar12)) {
        iVar2 = (int)((uVar10 & 0xffffffff) / (ulong)uVar12);
      }
      search::SearchInfo::calculateStopTime(local_1d8,iVar2,(int)local_1f0);
      search::go();
      if (local_210 != &local_200) {
        operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
      }
      if (local_1d0 != &local_1c0) {
        operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
      }
      std::__cxx11::istringstream::~istringstream(local_1b0);
      std::ios_base::~ios_base(local_138);
      return;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar2 == 0) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      lVar11 = strtol(pcVar1,&local_220,10);
      if (local_220 == pcVar1) {
        std::__throw_invalid_argument("stoi");
LAB_00105f0d:
        std::__throw_out_of_range("stoi");
LAB_00105f19:
        std::__throw_out_of_range("stoi");
        goto LAB_00105f25;
      }
      if ((lVar11 - 0x80000000U < 0xffffffff00000000) || (iVar3 = *piVar5, iVar3 == 0x22))
      goto LAB_00105f0d;
      goto LAB_00105e2d;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar2 == 0 && local_218->side == 0) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar10 = strtol(pcVar1,&local_220,10);
      if (local_220 != pcVar1) {
        if ((0xfffffffeffffffff < uVar10 - 0x80000000) && (iVar3 = *piVar5, iVar3 != 0x22))
        goto LAB_00105e2d;
        goto LAB_00105f19;
      }
LAB_00105f25:
      std::__throw_invalid_argument("stoi");
LAB_00105f31:
      std::__throw_out_of_range("stoi");
LAB_00105f3d:
      std::__throw_invalid_argument("stoi");
LAB_00105f49:
      std::__throw_out_of_range("stoi");
LAB_00105f55:
      std::__throw_invalid_argument("stoi");
LAB_00105f61:
      std::__throw_invalid_argument("stoi");
LAB_00105f6d:
      std::__throw_out_of_range("stoi");
LAB_00105f79:
      std::__throw_invalid_argument("stoi");
LAB_00105f85:
      std::__throw_out_of_range("stoi");
      goto LAB_00105f91;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if ((iVar2 == 0) && (local_218->side == 1)) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar10 = strtol(pcVar1,&local_220,10);
      if (local_220 != pcVar1) {
        if ((0xfffffffeffffffff < uVar10 - 0x80000000) && (iVar3 = *piVar5, iVar3 != 0x22))
        goto LAB_00105e2d;
        goto LAB_00105f31;
      }
      goto LAB_00105f3d;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar2 == 0 && local_218->side == 0) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(pcVar1,&local_220,10);
      if (local_220 != pcVar1) {
        local_1f0 = lVar6;
        if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (iVar3 = *piVar5, iVar3 != 0x22))
        goto LAB_00105e2d;
        goto LAB_00105f49;
      }
      goto LAB_00105f55;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if ((iVar2 == 0) && (local_218->side == 1)) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      lVar6 = strtol(pcVar1,&local_220,10);
      if (local_220 == pcVar1) goto LAB_00105f61;
      local_1f0 = lVar6;
      if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (iVar3 = *piVar5, iVar3 != 0x22))
      goto LAB_00105e2d;
      goto LAB_00105f6d;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
    if (iVar2 == 0) {
      std::operator>>((istream *)local_1b0,(string *)&local_210);
      pcVar1 = local_210;
      piVar5 = __errno_location();
      iVar2 = *piVar5;
      *piVar5 = 0;
      uVar7 = strtol(pcVar1,&local_220,10);
      if (local_220 == pcVar1) goto LAB_00105f79;
      local_1e0 = uVar7;
      if ((0xfffffffeffffffff < uVar7 - 0x80000000) && (iVar3 = *piVar5, iVar3 != 0x22))
      goto LAB_00105e2d;
      goto LAB_00105f85;
    }
    iVar2 = std::__cxx11::string::compare((char *)&local_1d0);
  } while (iVar2 != 0);
  std::operator>>((istream *)local_1b0,(string *)&local_210);
  pcVar1 = local_210;
  piVar5 = __errno_location();
  iVar2 = *piVar5;
  *piVar5 = 0;
  lVar6 = strtol(pcVar1,&local_220,10);
  if (local_220 == pcVar1) {
LAB_00105f91:
    std::__throw_invalid_argument("stoi");
  }
  else {
    local_1e8 = lVar6;
    if ((0xfffffffeffffffff < lVar6 - 0x80000000U) && (iVar3 = *piVar5, iVar3 != 0x22)) {
LAB_00105e2d:
      if (iVar3 == 0) {
        *piVar5 = iVar2;
      }
      goto LAB_00105a4c;
    }
  }
  uVar9 = std::__throw_out_of_range("stoi");
  if (*piVar5 == 0) {
    *piVar5 = iVar2;
  }
  if (local_210 != &local_200) {
    operator_delete(local_210,CONCAT71(uStack_1ff,local_200) + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,CONCAT71(uStack_1bf,local_1c0) + 1);
  }
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::ios_base::~ios_base(local_138);
  _Unwind_Resume(uVar9);
}

Assistant:

void io::uci::parseGo(const std::string& input, search::SearchInfo& info, board::Board& pos)
{
    int inc = 0;
    int depth = -1;
    int time = -1;
    int movetime = -1;
    int movestogo = -1;
    std::istringstream ss(input);
    std::string key;
    std::string val;
    while (ss >> key) {
        if (key == "depth") {
            ss >> val;
            depth = stoi(val);
        }
        else if (key == "wtime" && pos.getSide() == board::WHITE) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "btime" && pos.getSide() == board::BLACK) {
            ss >> val;
            time = stoi(val);
        }
        else if (key == "winc" && pos.getSide() == board::WHITE) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "binc" && pos.getSide() == board::BLACK) {
            ss >> val;
            inc = stoi(val);
        }
        else if (key == "movetime") {
            ss >> val;
            movetime = stoi(val);
        }
        else if (key == "movestogo") {
            ss >> val;
            movestogo = stoi(val);
        }
    }
    info.setStartTime();
    info.setDepth(depth);
    if (movetime > -1) {
        time = movetime;
        movestogo = 1;
    }
    if (time > -1 && movestogo > 0) {
        time /= movestogo;
    }
    info.calculateStopTime(time, inc);
    search::go(pos, info);
}